

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * fts5ConfigSkipLiteral(char *pIn)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  
  cVar1 = *pIn;
  if (cVar1 == '\'') {
    do {
      pcVar5 = pIn + 1;
      while( true ) {
        if (pcVar5 == (char *)0x0) {
          return (char *)0x0;
        }
        pIn = pcVar5;
        if ((*pcVar5 == '\'') && (pIn = pcVar5 + 1, pcVar5[1] != '\'')) {
          return pIn;
        }
        if (pIn[1] != '\0') break;
        pcVar5 = (char *)0x0;
      }
    } while( true );
  }
  if ((cVar1 == '+') || (cVar1 == '-')) {
    pcVar5 = pIn + 1;
LAB_001b35ac:
    do {
      pcVar3 = pcVar5;
      pcVar5 = pcVar3 + 1;
    } while (0xf5 < (byte)(*pcVar3 - 0x3aU));
    if (*pcVar3 == '.') {
      cVar1 = *pcVar5;
      while (0xf5 < (byte)(cVar1 - 0x3aU)) {
        pcVar3 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar5;
      }
    }
    if (pcVar3 != pIn) {
      return pcVar3;
    }
    return (char *)0x0;
  }
  if (cVar1 != 'N') {
    if ((cVar1 == 'X') || (cVar1 == 'x')) {
      if (pIn[1] != '\'') {
        return (char *)0x0;
      }
      pcVar5 = pIn + 3;
      bVar6 = false;
      do {
        if (9 < (byte)(pcVar5[-1] - 0x30U)) {
          uVar4 = (byte)pcVar5[-1] - 0x27;
          if (0x3f < uVar4) {
            return (char *)0x0;
          }
          if ((0xfc000000fc000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_001b35e6;
        }
        pcVar5 = pcVar5 + 1;
        bVar6 = (bool)(bVar6 ^ 1);
      } while( true );
    }
    pcVar5 = pIn;
    if (cVar1 != 'n') goto LAB_001b35ac;
  }
  iVar2 = sqlite3_strnicmp("null",pIn,4);
  pcVar5 = pIn + 4;
  bVar6 = iVar2 == 0;
LAB_001b35f0:
  pcVar3 = (char *)0x0;
  if (bVar6) {
    pcVar3 = pcVar5;
  }
  return pcVar3;
LAB_001b35e6:
  if ((ulong)uVar4 != 0) {
    return (char *)0x0;
  }
  bVar6 = !bVar6;
  goto LAB_001b35f0;
}

Assistant:

static const char *fts5ConfigSkipLiteral(const char *pIn){
  const char *p = pIn;
  switch( *p ){
    case 'n': case 'N':
      if( sqlite3_strnicmp("null", p, 4)==0 ){
        p = &p[4];
      }else{
        p = 0;
      }
      break;

    case 'x': case 'X':
      p++;
      if( *p=='\'' ){
        p++;
        while( (*p>='a' && *p<='f') 
            || (*p>='A' && *p<='F') 
            || (*p>='0' && *p<='9') 
            ){
          p++;
        }
        if( *p=='\'' && 0==((p-pIn)%2) ){
          p++;
        }else{
          p = 0;
        }
      }else{
        p = 0;
      }
      break;

    case '\'':
      p++;
      while( p ){
        if( *p=='\'' ){
          p++;
          if( *p!='\'' ) break;
        }
        p++;
        if( *p==0 ) p = 0;
      }
      break;

    default:
      /* maybe a number */
      if( *p=='+' || *p=='-' ) p++;
      while( fts5_isdigit(*p) ) p++;

      /* At this point, if the literal was an integer, the parse is 
      ** finished. Or, if it is a floating point value, it may continue
      ** with either a decimal point or an 'E' character. */
      if( *p=='.' && fts5_isdigit(p[1]) ){
        p += 2;
        while( fts5_isdigit(*p) ) p++;
      }
      if( p==pIn ) p = 0;

      break;
  }

  return p;
}